

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_insert_node_find_anchor(lyd_node *first_sibling,lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  
  if ((first_sibling == (lyd_node *)0x0) || ((first_sibling->flags & 8) == 0)) {
    plVar1 = lyd_insert_get_next_anchor(first_sibling,node);
    if (plVar1 != (lyd_node *)0x0) {
      return plVar1;
    }
    if (first_sibling == (lyd_node *)0x0) {
      return (lyd_node *)0x0;
    }
    if (node->schema == (lysc_node *)0x0) {
      return (lyd_node *)0x0;
    }
    plVar1 = first_sibling->prev;
    if (first_sibling->prev->schema == (lysc_node *)0x0) {
      do {
        plVar2 = plVar1;
        if (plVar2 == first_sibling) {
          return plVar2;
        }
        plVar1 = plVar2->prev;
      } while (plVar2->prev->schema == (lysc_node *)0x0);
      return plVar2;
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
lyd_insert_node_find_anchor(struct lyd_node *first_sibling, struct lyd_node *node)
{
    struct lyd_node *anchor;

    if (first_sibling && (first_sibling->flags & LYD_EXT)) {
        return NULL;
    }

    /* find the anchor, so we can insert somewhere before it */
    anchor = lyd_insert_get_next_anchor(first_sibling, node);
    /* cannot insert data node after opaque nodes */
    if (!anchor && node->schema && first_sibling && !first_sibling->prev->schema) {
        anchor = first_sibling->prev;
        while ((anchor != first_sibling) && !anchor->prev->schema) {
            anchor = anchor->prev;
        }
    }

    return anchor;
}